

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c
# Opt level: O0

void strarray_remove_ext(strarray *array,char *element,_Bool resize)

{
  size_t sVar1;
  size_t sVar2;
  char *pcVar3;
  size_t len;
  char *ptr1;
  _Bool resize_local;
  char *element_local;
  strarray *array_local;
  
  sVar1 = strlen(element);
  sVar2 = sVar1 + 1;
  if (sVar2 == array->length) {
    free(array->value);
    memset(array,0,0x10);
  }
  else {
    array->length = array->length - sVar2;
    if (element <= array->value + array->length) {
      memmove(element,element + sVar2,array->length - ((long)element - (long)array->value));
    }
    if ((resize) &&
       (pcVar3 = (char *)realloc(array->value,array->length + 0x3f & 0xffffffffffffffc0),
       pcVar3 != (char *)0x0)) {
      array->value = pcVar3;
    }
  }
  return;
}

Assistant:

void
strarray_remove_ext(struct strarray *array, char *element, bool resize) {
  char *ptr1;
  size_t len;

  /* get length of element to remove */
  len = strlen(element) + 1;
  if (len == array->length) {
    strarray_free(array);
    return;
  }

  /* adjust length */
  array->length -= len;

  /* remove element from memory */
  if (element <= array->value + array->length) {
    memmove(element, element + len, array->length - (element - array->value));
  }

  if (!resize) {
    return;
  }

  /* adjust memory block */
  ptr1 = realloc(array->value, STRARRAY_MEMSIZE(array->length));
  if (ptr1 == NULL) {
    /* just keep the current memory block */
    return;
  }

  /* adjust value pointer to new memory block */
  array->value = ptr1;
}